

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

bool wabt::interp::Func::classof(Object *obj)

{
  ObjectKind OVar1;
  Object *obj_local;
  
  OVar1 = Object::kind(obj);
  obj_local._7_1_ = OVar1 == DefinedFunc || OVar1 == HostFunc;
  return obj_local._7_1_;
}

Assistant:

inline bool Func::classof(const Object* obj) {
  switch (obj->kind()) {
    case ObjectKind::DefinedFunc:
    case ObjectKind::HostFunc:
      return true;
    default:
      return false;
  }
}